

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O1

string * __thiscall
vox::VoxWriter::GetErrnoMsg_abi_cxx11_
          (string *__return_storage_ptr__,VoxWriter *this,int32_t *vError)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(this->MV_VERSION) {
  case 1:
    pcVar1 = "Operation not permitted";
    break;
  case 2:
    pcVar1 = "No such file or directory";
    break;
  case 3:
    pcVar1 = "No such process";
    break;
  case 4:
    pcVar1 = "Interrupted function";
    break;
  case 5:
    pcVar1 = "I / O error";
    break;
  case 6:
    pcVar1 = "No such device or address";
    break;
  case 7:
    pcVar1 = "Argument list too long";
    break;
  case 8:
    pcVar1 = "Exec format error";
    break;
  case 9:
    pcVar1 = "Bad file number";
    break;
  case 10:
    pcVar1 = "No spawned processes";
    break;
  case 0xb:
    pcVar1 = "No more processes or not enough memory or maximum nesting level reached";
    break;
  case 0xc:
    pcVar1 = "Not enough memory";
    break;
  case 0xd:
    pcVar1 = "Permission denied";
    break;
  case 0xe:
    pcVar1 = "Bad address";
    break;
  default:
    goto switchD_00108758_caseD_f;
  case 0x10:
    pcVar1 = "Device or resource busy";
    break;
  case 0x11:
    pcVar1 = "File exists";
    break;
  case 0x12:
    pcVar1 = "Cross - device link";
    break;
  case 0x13:
    pcVar1 = "No such device";
    break;
  case 0x14:
    pcVar1 = "Not a director";
    break;
  case 0x15:
    pcVar1 = "Is a directory";
    break;
  case 0x16:
    pcVar1 = "Invalid argument";
    break;
  case 0x17:
    pcVar1 = "Too many files open in system";
    break;
  case 0x18:
    pcVar1 = "Too many open files";
    break;
  case 0x19:
    pcVar1 = "Inappropriate I / O control operation";
    break;
  case 0x1b:
    pcVar1 = "File too large";
    break;
  case 0x1c:
    pcVar1 = "No space left on device";
    break;
  case 0x1d:
    pcVar1 = "Invalid seek";
    break;
  case 0x1e:
    pcVar1 = "Read - only file system";
    break;
  case 0x1f:
    pcVar1 = "Too many links";
    break;
  case 0x20:
    pcVar1 = "Broken pipe";
    break;
  case 0x21:
    pcVar1 = "Math argument";
    break;
  case 0x22:
    pcVar1 = "Result too large";
    break;
  case 0x24:
    pcVar1 = "Resource deadlock would occur";
    break;
  case 0x26:
    pcVar1 = "Filename too long";
    break;
  case 0x27:
    pcVar1 = "No locks available";
    break;
  case 0x28:
    pcVar1 = "Function not supported";
    break;
  case 0x29:
    pcVar1 = "Directory not empty";
    break;
  case 0x2a:
    pcVar1 = "Illegal byte sequence";
    break;
  case 0x50:
    pcVar1 = "String was truncated";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
switchD_00108758_caseD_f:
  return __return_storage_ptr__;
}

Assistant:

std::string VoxWriter::GetErrnoMsg(const int32_t& vError) {
    std::string res;

    switch (vError) {
        case 1: res = "Operation not permitted"; break;
        case 2: res = "No such file or directory"; break;
        case 3: res = "No such process"; break;
        case 4: res = "Interrupted function"; break;
        case 5: res = "I / O error"; break;
        case 6: res = "No such device or address"; break;
        case 7: res = "Argument list too long"; break;
        case 8: res = "Exec format error"; break;
        case 9: res = "Bad file number"; break;
        case 10: res = "No spawned processes"; break;
        case 11: res = "No more processes or not enough memory or maximum nesting level reached"; break;
        case 12: res = "Not enough memory"; break;
        case 13: res = "Permission denied"; break;
        case 14: res = "Bad address"; break;
        case 16: res = "Device or resource busy"; break;
        case 17: res = "File exists"; break;
        case 18: res = "Cross - device link"; break;
        case 19: res = "No such device"; break;
        case 20: res = "Not a director"; break;
        case 21: res = "Is a directory"; break;
        case 22: res = "Invalid argument"; break;
        case 23: res = "Too many files open in system"; break;
        case 24: res = "Too many open files"; break;
        case 25: res = "Inappropriate I / O control operation"; break;
        case 27: res = "File too large"; break;
        case 28: res = "No space left on device"; break;
        case 29: res = "Invalid seek"; break;
        case 30: res = "Read - only file system"; break;
        case 31: res = "Too many links"; break;
        case 32: res = "Broken pipe"; break;
        case 33: res = "Math argument"; break;
        case 34: res = "Result too large"; break;
        case 36: res = "Resource deadlock would occur"; break;
        case 38: res = "Filename too long"; break;
        case 39: res = "No locks available"; break;
        case 40: res = "Function not supported"; break;
        case 41: res = "Directory not empty"; break;
        case 42: res = "Illegal byte sequence"; break;
        case 80: res = "String was truncated"; break;
    }

    return res;
}